

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

uint8_t rcg::anon_unknown_3::rgb2Grey(uint8_t r,uint8_t g,uint8_t b)

{
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000039;
  
  return (uint8_t)(CONCAT31(in_register_00000011,b) * 0xe98 +
                   CONCAT31(in_register_00000031,g) * 0x4b22 +
                   CONCAT31(in_register_00000039,r) * 0x2646 + 0x4000U >> 0xf);
}

Assistant:

inline uint8_t rgb2Grey(uint8_t r, uint8_t g, uint8_t b)
{
  return static_cast<uint8_t>((9798*static_cast<uint32_t>(r)+
                               19234*static_cast<uint32_t>(g)+
                               3736*static_cast<uint32_t>(b)+16384)>>15);
}